

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O1

void __thiscall VertexClustering::VertexClustering(VertexClustering *this,Options *opts)

{
  pointer ppVVar1;
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  VertexGroup *this_00;
  VCCluster *pVVar8;
  _Rb_tree_header *p_Var9;
  ulong uVar10;
  pointer ppVVar11;
  
  (this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var9 = &(this->edgeMap)._M_t._M_impl.super__Rb_tree_header;
  (this->edgeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->edgeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->edgeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var9->_M_header;
  (this->edgeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var9->_M_header;
  (this->edgeMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->boundary).c.super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->boundary).c.super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->boundary).c.super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->boundary).c.super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->boundary).c.super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->boundary).c.super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->boundary).c.super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->boundary).c.super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->boundary).c.super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->boundary).c.super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<VCEdge,_std::allocator<VCEdge>_>::_M_initialize_map
            ((_Deque_base<VCEdge,_std::allocator<VCEdge>_> *)&this->boundary,0);
  this->cntFace = 0;
  srand(opts->seed);
  if (opts->anisotropic == true) {
    opts->adaptive = true;
  }
  uVar2 = *(undefined4 *)&opts->field_0x14;
  (this->opts).seed = opts->seed;
  *(undefined4 *)&(this->opts).field_0x14 = uVar2;
  bVar3 = opts->adaptive;
  bVar4 = opts->anisotropic;
  bVar5 = opts->quadMetric;
  bVar6 = opts->validation;
  iVar7 = opts->ringLevel;
  (this->opts).numCluster = opts->numCluster;
  (this->opts).adaptive = bVar3;
  (this->opts).anisotropic = bVar4;
  (this->opts).quadMetric = bVar5;
  (this->opts).validation = bVar6;
  (this->opts).ringLevel = iVar7;
  this_00 = (VertexGroup *)operator_new(0x4c4b410);
  VertexGroup::VertexGroup(this_00);
  this->vGroup = this_00;
  this->vGroupNew = (VertexGroup *)0x0;
  this->angle_min = 180.0;
  this->angle_less_30 = 100.0;
  std::vector<VCCluster_*,_std::allocator<VCCluster_*>_>::resize
            (&this->clusters,opts->numCluster + 1);
  ppVVar11 = (this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppVVar1 = (this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (opts->anisotropic == true) {
    if (opts->quadMetric == false) {
      if (ppVVar1 != ppVVar11) {
        uVar10 = 0;
        do {
          pVVar8 = (VCCluster *)operator_new(0x150);
          pVVar8->id = (int)uVar10;
          p_Var9 = &(pVVar8->items)._M_t._M_impl.super__Rb_tree_header;
          (pVVar8->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          (pVVar8->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          (pVVar8->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var9->_M_header;
          (pVVar8->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var9->_M_header
          ;
          (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[0] = 0.0;
          (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[1] = 0.0;
          (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[2] = 0.0;
          (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[3] = 0.0;
          (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[4] = 0.0;
          (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[5] = 0.0;
          (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[6] = 0.0;
          (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[7] = 0.0;
          (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[8] = 0.0;
          (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[9] = 0.0;
          (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[10] = 0.0;
          (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[0xb] = 0.0;
          (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[0xc] = 0.0;
          (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[0xd] = 0.0;
          (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[0xe] = 0.0;
          (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[0xf] = 0.0;
          (pVVar8->items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          (pVVar8->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[0] = 0.0;
          (pVVar8->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[1] = 0.0;
          (pVVar8->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[2] = 0.0;
          *(undefined8 *)
           ((long)(pVVar8->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                  .m_storage.m_data.array + 0x11) = 0;
          *(undefined8 *)((long)&pVVar8->area + 1) = 0;
          pVVar8->_vptr_VCCluster = (_func_int **)&PTR_addItemAdditionalAct_0014ac88;
          pVVar8[1].weightedSum.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[2] = 0.0;
          pVVar8[1].area = 0.0;
          pVVar8[1].weightedSum.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[0] = 0.0;
          pVVar8[1].weightedSum.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[1] = 0.0;
          pVVar8[1].items._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
          pVVar8[1].items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          pVVar8[1].items._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          pVVar8[1].items._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
          *(undefined8 *)&pVVar8[1].items._M_t._M_impl = 0;
          *(undefined8 *)&pVVar8[1].items._M_t._M_impl.super__Rb_tree_header._M_header = 0;
          pVVar8[1]._vptr_VCCluster = (_func_int **)0x0;
          *(undefined8 *)&pVVar8[1].id = 0;
          ppVVar11[uVar10] = pVVar8;
          uVar10 = uVar10 + 1;
          ppVVar11 = (this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        } while (uVar10 < (ulong)((long)(this->clusters).
                                        super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar11
                                 >> 3));
      }
    }
    else if (ppVVar1 != ppVVar11) {
      uVar10 = 0;
      do {
        pVVar8 = (VCCluster *)operator_new(0x160);
        pVVar8->id = (int)uVar10;
        p_Var9 = &(pVVar8->items)._M_t._M_impl.super__Rb_tree_header;
        (pVVar8->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        (pVVar8->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        (pVVar8->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var9->_M_header;
        (pVVar8->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var9->_M_header;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[1] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[2] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[3] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[4] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[5] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[6] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[7] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[8] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[9] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[10] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xb] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xc] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xd] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xe] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xf] = 0.0;
        (pVVar8->items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        (pVVar8->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
        .m_data.array[0] = 0.0;
        (pVVar8->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
        .m_data.array[1] = 0.0;
        (pVVar8->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
        .m_data.array[2] = 0.0;
        *(undefined8 *)
         ((long)(pVVar8->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array + 0x11) = 0;
        *(undefined8 *)((long)&pVVar8->area + 1) = 0;
        pVVar8->_vptr_VCCluster = (_func_int **)&PTR_addItemAdditionalAct_0014ac88;
        pVVar8[1].weightedSum.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
        .m_data.array[2] = 0.0;
        pVVar8[1].area = 0.0;
        pVVar8[1].weightedSum.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
        .m_data.array[0] = 0.0;
        pVVar8[1].weightedSum.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
        .m_data.array[1] = 0.0;
        pVVar8[1].items._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
        pVVar8[1].items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        pVVar8[1].items._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        pVVar8[1].items._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
        *(undefined8 *)&pVVar8[1].items._M_t._M_impl = 0;
        *(undefined8 *)&pVVar8[1].items._M_t._M_impl.super__Rb_tree_header._M_header = 0;
        pVVar8[1]._vptr_VCCluster = (_func_int **)0x0;
        *(undefined8 *)&pVVar8[1].id = 0;
        pVVar8->_vptr_VCCluster = (_func_int **)&PTR_addItemAdditionalAct_0014acf0;
        *(undefined **)&pVVar8[1].isNull = &DAT_0014ad40;
        ppVVar11[uVar10] = pVVar8;
        uVar10 = uVar10 + 1;
        ppVVar11 = (this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      } while (uVar10 < (ulong)((long)(this->clusters).
                                      super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar11 >>
                               3));
    }
  }
  else if (opts->quadMetric == false) {
    if (ppVVar1 != ppVVar11) {
      uVar10 = 0;
      do {
        pVVar8 = (VCCluster *)operator_new(0xf0);
        pVVar8->_vptr_VCCluster = (_func_int **)&PTR_addItemAdditionalAct_0014ab60;
        pVVar8->id = (int)uVar10;
        p_Var9 = &(pVVar8->items)._M_t._M_impl.super__Rb_tree_header;
        (pVVar8->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        (pVVar8->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        (pVVar8->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var9->_M_header;
        (pVVar8->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var9->_M_header;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[1] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[2] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[3] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[4] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[5] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[6] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[7] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[8] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[9] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[10] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xb] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xc] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xd] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xe] = 0.0;
        (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xf] = 0.0;
        (pVVar8->items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        (pVVar8->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
        .m_data.array[0] = 0.0;
        (pVVar8->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
        .m_data.array[1] = 0.0;
        (pVVar8->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
        .m_data.array[2] = 0.0;
        *(undefined8 *)
         ((long)(pVVar8->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array + 0x11) = 0;
        *(undefined8 *)((long)&pVVar8->area + 1) = 0;
        ppVVar11[uVar10] = pVVar8;
        uVar10 = uVar10 + 1;
        ppVVar11 = (this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      } while (uVar10 < (ulong)((long)(this->clusters).
                                      super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar11 >>
                               3));
    }
  }
  else if (ppVVar1 != ppVVar11) {
    uVar10 = 0;
    do {
      pVVar8 = (VCCluster *)operator_new(0x100);
      pVVar8->id = (int)uVar10;
      p_Var9 = &(pVVar8->items)._M_t._M_impl.super__Rb_tree_header;
      (pVVar8->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (pVVar8->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (pVVar8->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var9->_M_header;
      (pVVar8->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var9->_M_header;
      (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
      array[0] = 0.0;
      (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
      array[1] = 0.0;
      (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
      array[2] = 0.0;
      (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
      array[3] = 0.0;
      (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
      array[4] = 0.0;
      (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
      array[5] = 0.0;
      (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
      array[6] = 0.0;
      (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
      array[7] = 0.0;
      (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
      array[8] = 0.0;
      (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
      array[9] = 0.0;
      (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
      array[10] = 0.0;
      (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
      array[0xb] = 0.0;
      (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
      array[0xc] = 0.0;
      (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
      array[0xd] = 0.0;
      (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
      array[0xe] = 0.0;
      (pVVar8->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
      array[0xf] = 0.0;
      (pVVar8->items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      (pVVar8->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[0] = 0.0;
      (pVVar8->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[1] = 0.0;
      (pVVar8->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
      m_data.array[2] = 0.0;
      *(undefined8 *)
       ((long)(pVVar8->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array + 0x11) = 0;
      *(undefined8 *)((long)&pVVar8->area + 1) = 0;
      pVVar8->_vptr_VCCluster = (_func_int **)&PTR_addItemAdditionalAct_0014abd8;
      pVVar8[1]._vptr_VCCluster = (_func_int **)&DAT_0014ac28;
      ppVVar11[uVar10] = pVVar8;
      uVar10 = uVar10 + 1;
      ppVVar11 = (this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(this->clusters).
                                    super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar11 >> 3)
            );
  }
  (*(this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>._M_impl.
    super__Vector_impl_data._M_start)->isNull = true;
  return;
}

Assistant:

VertexClustering::VertexClustering(VertexClustering::Options &opts): cntFace(0)
{
	srand(opts.seed);
	if (opts.anisotropic) {
		opts.adaptive = true;
	}
	this->opts = opts;
	vGroup = new VertexGroup();
	vGroupNew = NULL;
	angle_min = 180;
	angle_less_30 = 100;
	clusters.resize(opts.numCluster + 1); 
	if (opts.anisotropic) {
		if (opts.quadMetric) {
			for (int i = 0; i < clusters.size(); i++)
				clusters[i] = new VCClusterAnisoQuad(i);
		}
		else {
			for (int i = 0; i < clusters.size(); i++)
				clusters[i] = new VCClusterAniso(i);
		}
	}
	else
		if (opts.quadMetric) {
			for (int i = 0; i < clusters.size(); i++)
				clusters[i] = new VCClusterQuad(i);
		}
		else {
			for (int i = 0; i < clusters.size(); i++)
				clusters[i] = new VCCluster(i);
		}
	clusters[0]->isNull = true;
}